

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::ExpParameter::MergePartialFromCodedStream(ExpParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  float *pfVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  UnknownFieldSet *unknown_fields;
  char cVar8;
  uint tag;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float local_3c;
  float local_38;
  float local_34;
  
LAB_003aee32:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003aee56;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003aee56:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    tag = (uint)uVar9;
    if ((uVar9 & 0x100000000) != 0) {
      uVar7 = (uint)(uVar9 >> 3) & 0x1fffffff;
      cVar8 = (char)uVar9;
      if (uVar7 == 3) {
        if (cVar8 == '\x1d') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar10 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                               (input,(uint32 *)&local_34);
            fVar11 = local_34;
            if (!bVar10) {
              return false;
            }
          }
          else {
            fVar11 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->shift_ = fVar11;
          goto LAB_003aee32;
        }
      }
      else if (uVar7 == 2) {
        if (cVar8 == '\x15') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar10 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                               (input,(uint32 *)&local_38);
            fVar11 = local_38;
            if (!bVar10) {
              return false;
            }
          }
          else {
            fVar11 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->scale_ = fVar11;
          goto LAB_003aee32;
        }
      }
      else if ((uVar7 == 1) && (cVar8 == '\r')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pfVar4 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
          bVar10 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                             (input,(uint32 *)&local_3c);
          fVar11 = local_3c;
          if (!bVar10) {
            return false;
          }
        }
        else {
          fVar11 = *pfVar4;
          input->buffer_ = (uint8 *)(pfVar4 + 1);
        }
        this->base_ = fVar11;
        goto LAB_003aee32;
      }
    }
    bVar10 = (tag & 7) == 4 || tag == 0;
    if (bVar10) {
      return bVar10;
    }
    pvVar3 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      unknown_fields =
           google::protobuf::internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
    }
    else {
      unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar5 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
    if (!bVar5) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool ExpParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ExpParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional float base = 1 [default = -1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {
          set_has_base();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &base_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float shift = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_shift();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &shift_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ExpParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ExpParameter)
  return false;
#undef DO_
}